

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v2_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  jpeg_upsampler *pjVar2;
  JSAMPLE *pJVar3;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var4;
  _func_void_j_decompress_ptr *p_Var5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var6;
  JSAMPROW pJVar7;
  JSAMPROW pJVar8;
  JSAMPROW pJVar9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  pjVar2 = cinfo->upsample;
  pJVar3 = cinfo->sample_range_limit;
  p_Var4 = pjVar2[1].upsample;
  lVar18 = *(long *)&pjVar2[1].need_context_rows;
  p_Var5 = pjVar2[2].start_pass;
  p_Var6 = pjVar2[2].upsample;
  pJVar7 = (*input_buf)[in_row_group_ctr * 2];
  pJVar8 = (*input_buf)[(ulong)(in_row_group_ctr * 2) + 1];
  pJVar9 = input_buf[1][in_row_group_ctr];
  pJVar10 = input_buf[2][in_row_group_ctr];
  pJVar11 = *output_buf;
  pJVar12 = output_buf[1];
  uVar1 = cinfo->output_width;
  lVar14 = 0;
  for (lVar15 = 0; uVar1 >> 1 != (uint)lVar15; lVar15 = lVar15 + 1) {
    uVar16 = (ulong)pJVar9[lVar15];
    uVar20 = (ulong)pJVar10[lVar15];
    lVar19 = (long)*(int *)(p_Var4 + uVar20 * 4);
    lVar21 = *(long *)(p_Var5 + uVar20 * 8);
    lVar13 = *(long *)(p_Var6 + uVar16 * 8);
    lVar17 = (long)*(int *)(lVar18 + uVar16 * 4);
    uVar16 = (ulong)pJVar7[lVar15 * 2];
    pJVar11[lVar14] = pJVar3[lVar19 + uVar16];
    lVar21 = (long)(int)((ulong)(lVar21 + lVar13) >> 0x10);
    pJVar11[lVar14 + 1] = pJVar3[uVar16 + lVar21];
    pJVar11[lVar14 + 2] = pJVar3[uVar16 + lVar17];
    uVar16 = (ulong)pJVar7[lVar15 * 2 + 1];
    pJVar11[lVar14 + 3] = pJVar3[lVar19 + uVar16];
    pJVar11[lVar14 + 4] = pJVar3[uVar16 + lVar21];
    pJVar11[lVar14 + 5] = pJVar3[uVar16 + lVar17];
    uVar16 = (ulong)pJVar8[lVar15 * 2];
    pJVar12[lVar14] = pJVar3[lVar19 + uVar16];
    pJVar12[lVar14 + 1] = pJVar3[uVar16 + lVar21];
    pJVar12[lVar14 + 2] = pJVar3[uVar16 + lVar17];
    uVar16 = (ulong)pJVar8[lVar15 * 2 + 1];
    pJVar12[lVar14 + 3] = pJVar3[lVar19 + uVar16];
    pJVar12[lVar14 + 4] = pJVar3[lVar21 + uVar16];
    pJVar12[lVar14 + 5] = pJVar3[lVar17 + uVar16];
    lVar14 = lVar14 + 6;
  }
  if ((cinfo->output_width & 1) != 0) {
    uVar16 = (ulong)pJVar9[lVar15];
    uVar20 = (ulong)pJVar10[lVar15];
    lVar21 = *(long *)(p_Var5 + uVar20 * 8);
    lVar13 = *(long *)(p_Var6 + uVar16 * 8);
    lVar17 = (long)*(int *)(p_Var4 + uVar20 * 4);
    lVar18 = (long)*(int *)(lVar18 + uVar16 * 4);
    uVar16 = (ulong)pJVar7[lVar15 * 2];
    pJVar11[lVar14] = pJVar3[lVar17 + uVar16];
    lVar21 = (long)(int)((ulong)(lVar21 + lVar13) >> 0x10);
    pJVar11[lVar14 + 1] = pJVar3[uVar16 + lVar21];
    pJVar11[lVar14 + 2] = pJVar3[uVar16 + lVar18];
    uVar16 = (ulong)pJVar8[lVar15 * 2];
    pJVar12[lVar14] = pJVar3[lVar17 + uVar16];
    pJVar12[lVar14 + 1] = pJVar3[lVar21 + uVar16];
    pJVar12[lVar14 + 2] = pJVar3[lVar18 + uVar16];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr0, outptr1;
  JSAMPROW inptr00, inptr01, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr00 = input_buf[0][in_row_group_ctr*2];
  inptr01 = input_buf[0][in_row_group_ctr*2 + 1];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr0 = output_buf[0];
  outptr1 = output_buf[1];
  /* Loop for each group of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 4 Y values and emit 4 pixels */
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr00++);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    outptr0 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr01++);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
    outptr1 += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr00);
    outptr0[RGB_RED] =   range_limit[y + cred];
    outptr0[RGB_GREEN] = range_limit[y + cgreen];
    outptr0[RGB_BLUE] =  range_limit[y + cblue];
    y  = GETJSAMPLE(*inptr01);
    outptr1[RGB_RED] =   range_limit[y + cred];
    outptr1[RGB_GREEN] = range_limit[y + cgreen];
    outptr1[RGB_BLUE] =  range_limit[y + cblue];
  }
}